

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
SetProperty_JavascriptString
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,JavascriptString *propertyNameString,Var value,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *param_5,PropertyValueInfo *info)

{
  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  undefined8 this_01;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  BOOL BVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  undefined1 local_60 [8];
  CharacterBuffer<char16_t> propertyName;
  
  descriptor = param_5;
  propertyName._8_8_ = this;
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar6,cVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4dd,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_60);
  local_60 = (undefined1  [8])pcVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_60);
  this_01 = propertyName._8_8_;
  this_00 = *(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
              **)(propertyName._8_8_ + 0x18);
  propertyName.string.ptr._0_4_ = cVar3;
  uVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    (this_00,(CharacterBuffer<char16_t> *)local_60);
  if (-1 < (int)uVar4) {
    descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                 ((ulong)uVar4 * 0x18 + *(long *)(this_00 + 8));
  }
  if ((int)uVar4 < 0) {
    BVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
            AddProperty<Js::JavascriptString*>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>
                        *)this_01,instance,propertyNameString,value,'\a',info,
                       (PropertyOperationFlags)param_5,SideEffects_Any);
  }
  else {
    BVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
            SetPropertyFromDescriptor<false,Js::JavascriptString*>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>
                        *)this_01,instance,-1,propertyNameString,descriptor,value,
                       (PropertyOperationFlags)param_5,info);
  }
  return BVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_JavascriptString(DynamicObject* instance, JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, TemplateParameter::Box<JavascriptString*>)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return SetPropertyFromDescriptor<false>(instance, Constants::NoProperty, propertyNameString, descriptor, value, flags, info);
        }

        return this->AddProperty(instance, propertyNameString, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }